

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::PartitionedColumnData::FlushAppendState
          (PartitionedColumnData *this,PartitionedColumnDataAppendState *state)

{
  bool bVar1;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *pvVar2;
  type this_00;
  idx_t iVar3;
  long in_RSI;
  DataChunk *partition_buffer;
  idx_t i;
  DataChunk *in_stack_00000038;
  ColumnDataCollection *in_stack_00000040;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *this_01;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *local_18;
  
  local_18 = (vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              *)0x0;
  while (this_01 = local_18,
        pvVar2 = (vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                    ::size((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                            *)(in_RSI + 0x130)), this_01 < pvVar2) {
    vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                  *)this_01,in_stack_ffffffffffffffc8);
    bVar1 = ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::
            operator_bool((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                          0x2b6ef7b);
    if (bVar1) {
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                    *)this_01,in_stack_ffffffffffffffc8);
      this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)this_01);
      iVar3 = DataChunk::size(this_00);
      if (iVar3 != 0) {
        vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
        ::operator[](this_01,in_stack_ffffffffffffffc8);
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
        ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                      *)this_01);
        ColumnDataCollection::Append(in_stack_00000040,in_stack_00000038);
        DataChunk::Reset((DataChunk *)this);
      }
    }
    local_18 = (vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                *)((long)&(local_18->
                          super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void PartitionedColumnData::FlushAppendState(PartitionedColumnDataAppendState &state) {
	for (idx_t i = 0; i < state.partition_buffers.size(); i++) {
		if (!state.partition_buffers[i]) {
			continue;
		}
		auto &partition_buffer = *state.partition_buffers[i];
		if (partition_buffer.size() > 0) {
			partitions[i]->Append(partition_buffer);
			partition_buffer.Reset();
		}
	}
}